

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_l1.c
# Opt level: O2

int picnic3_l1_read_private_key(picnic3_l1_privatekey_t *key,uint8_t *buf,size_t buflen)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  picnic_instance_t *ppVar8;
  int iVar9;
  
  iVar9 = -1;
  if ((buflen != 0 && (buf != (uint8_t *)0x0 && key != (picnic3_l1_privatekey_t *)0x0)) &&
     (*buf == '\a')) {
    ppVar8 = picnic_instance_get(Picnic3_L1);
    if ((0x33 < buflen) &&
       ((ppVar8 != (picnic_instance_t *)0x0 && (((buf[0x22] | buf[0x11] | buf[0x33]) & 0x7f) == 0)))
       ) {
      uVar1 = *(undefined8 *)(buf + 1);
      uVar2 = *(undefined8 *)(buf + 9);
      uVar3 = *(undefined8 *)(buf + 0x11);
      uVar4 = *(undefined8 *)(buf + 0x19);
      uVar5 = *(undefined8 *)(buf + 0x1c);
      uVar6 = *(undefined8 *)(buf + 0x24);
      uVar7 = *(undefined8 *)(buf + 0x2c);
      iVar9 = 0;
      *(undefined8 *)(key->data + 0x13) = *(undefined8 *)(buf + 0x14);
      *(undefined8 *)(key->data + 0x1b) = uVar5;
      *(undefined8 *)(key->data + 0x23) = uVar6;
      *(undefined8 *)(key->data + 0x2b) = uVar7;
      *(undefined8 *)key->data = uVar1;
      *(undefined8 *)(key->data + 8) = uVar2;
      *(undefined8 *)(key->data + 0x10) = uVar3;
      *(undefined8 *)(key->data + 0x18) = uVar4;
    }
  }
  return iVar9;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic3_l1_read_private_key(picnic3_l1_privatekey_t* key,
                                                            const uint8_t* buf, size_t buflen) {
  if (!key || !buf || buflen < 1) {
    return -1;
  }

  const picnic_params_t param = buf[0];
  if (param != PARAM) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  if (buflen < PRIVATE_KEY_SIZE) {
    return -1;
  }

#if (LOWMC_BLOCK_BITS & 0x7) != 0
  static const unsigned int diff = LOWMC_BLOCK_SZ * 8 - LOWMC_BLOCK_BITS;
  /* sanity check of public data: padding bits need to be 0 */
  const int check = check_padding_bits(buf[1 + LOWMC_BLOCK_SZ - 1], diff) |
                    check_padding_bits(buf[1 + 2 * LOWMC_BLOCK_SZ - 1], diff) |
                    check_padding_bits(buf[1 + 3 * LOWMC_BLOCK_SZ - 1], diff);
  picnic_declassify(&check, sizeof(check));
  if (check) {
    return -1;
  }
#endif

  memcpy(key->data, buf + 1, PRIVATE_KEY_SIZE - 1);
  return 0;
}